

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BoundingBoxHelpers.cpp
# Opt level: O3

bool __thiscall
iDynTree::BoundingBoxProjectionConstraint::buildBoundingBox
          (BoundingBoxProjectionConstraint *this,Direction *xAxisOfPlaneInWorld,
          Direction *yAxisOfPlaneInWorld,Position *originOfPlaneInWorld,
          vector<iDynTree::Polygon,_std::allocator<iDynTree::Polygon>_>
          *supportPolygonsExpressedInSupportFrame,
          vector<iDynTree::Transform,_std::allocator<iDynTree::Transform>_>
          *absoluteFrame_X_supportFrame)

{
  undefined8 *puVar1;
  void *pvVar2;
  long lVar3;
  pointer pVVar4;
  double dVar5;
  double dVar6;
  iterator iVar7;
  size_t sVar8;
  Position *pPVar9;
  PointerType ptr_2;
  PointerType ptr;
  long lVar10;
  pointer pPVar11;
  vector<iDynTree::Transform,_std::allocator<iDynTree::Transform>_> *pvVar12;
  undefined8 uVar13;
  PointerType ptr_1;
  long lVar14;
  iterator __begin1;
  VectorFixSize<2U> *pVVar15;
  iterator __end1;
  ulong uVar16;
  pair<__gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>_>
  pVar17;
  pair<__gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>_>
  pVar18;
  vector<double,_std::allocator<double>_> xCoords;
  vector<double,_std::allocator<double>_> yCoords;
  vector<iDynTree::VectorFixSize<2U>,_std::allocator<iDynTree::VectorFixSize<2U>_>_> projectedPoints
  ;
  vector<iDynTree::Polygon,_std::allocator<iDynTree::Polygon>_>
  supportPolygonsExpressedInAbsoluteFrame;
  VectorFixSize<2U> point;
  Polygon local_d8;
  vector<iDynTree::Transform,_std::allocator<iDynTree::Transform>_> *local_c0;
  VectorFixSize<2U> local_b8;
  double *local_a8;
  VectorFixSize<2U> *local_98;
  iterator iStack_90;
  VectorFixSize<2U> *local_88;
  vector<iDynTree::Polygon,_std::allocator<iDynTree::Polygon>_> local_78;
  double local_58;
  double dStack_50;
  double local_48;
  double local_40;
  double local_38;
  
  local_c0 = absoluteFrame_X_supportFrame;
  iDynTree::Position::operator=(&this->o,originOfPlaneInWorld);
  uVar13 = *(undefined8 *)(xAxisOfPlaneInWorld + 8);
  *(undefined8 *)&this->P = *(undefined8 *)xAxisOfPlaneInWorld;
  *(undefined8 *)&this->field_0x70 = uVar13;
  *(undefined8 *)&this->field_0x78 = *(undefined8 *)(xAxisOfPlaneInWorld + 0x10);
  uVar13 = *(undefined8 *)(yAxisOfPlaneInWorld + 8);
  *(undefined8 *)&this->field_0x80 = *(undefined8 *)yAxisOfPlaneInWorld;
  *(undefined8 *)&this->field_0x88 = uVar13;
  *(undefined8 *)&this->field_0x90 = *(undefined8 *)(yAxisOfPlaneInWorld + 0x10);
  local_78.super__Vector_base<iDynTree::Polygon,_std::allocator<iDynTree::Polygon>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_78.super__Vector_base<iDynTree::Polygon,_std::allocator<iDynTree::Polygon>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_78.super__Vector_base<iDynTree::Polygon,_std::allocator<iDynTree::Polygon>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<iDynTree::Polygon,_std::allocator<iDynTree::Polygon>_>::resize
            (&local_78,
             ((long)(supportPolygonsExpressedInSupportFrame->
                    super__Vector_base<iDynTree::Polygon,_std::allocator<iDynTree::Polygon>_>).
                    _M_impl.super__Vector_impl_data._M_finish -
              (long)(supportPolygonsExpressedInSupportFrame->
                    super__Vector_base<iDynTree::Polygon,_std::allocator<iDynTree::Polygon>_>).
                    _M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555);
  pPVar11 = (supportPolygonsExpressedInSupportFrame->
            super__Vector_base<iDynTree::Polygon,_std::allocator<iDynTree::Polygon>_>)._M_impl.
            super__Vector_impl_data._M_start;
  if ((supportPolygonsExpressedInSupportFrame->
      super__Vector_base<iDynTree::Polygon,_std::allocator<iDynTree::Polygon>_>)._M_impl.
      super__Vector_impl_data._M_finish != pPVar11) {
    lVar10 = 0;
    lVar14 = 0;
    uVar16 = 0;
    do {
      Polygon::applyTransform
                (&local_d8,
                 (Polygon *)
                 ((long)&(pPVar11->m_vertices).
                         super__Vector_base<iDynTree::Position,_std::allocator<iDynTree::Position>_>
                         ._M_impl.super__Vector_impl_data._M_start + lVar14),
                 (Transform *)(*(long *)local_c0 + lVar10));
      pvVar2 = *(void **)((long)&((local_78.
                                   super__Vector_base<iDynTree::Polygon,_std::allocator<iDynTree::Polygon>_>
                                   ._M_impl.super__Vector_impl_data._M_start)->m_vertices).
                                 super__Vector_base<iDynTree::Position,_std::allocator<iDynTree::Position>_>
                                 ._M_impl.super__Vector_impl_data._M_start + lVar14);
      lVar3 = *(long *)((long)&((local_78.
                                 super__Vector_base<iDynTree::Polygon,_std::allocator<iDynTree::Polygon>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->m_vertices).
                               super__Vector_base<iDynTree::Position,_std::allocator<iDynTree::Position>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage + lVar14);
      puVar1 = (undefined8 *)
               ((long)&((local_78.
                         super__Vector_base<iDynTree::Polygon,_std::allocator<iDynTree::Polygon>_>.
                         _M_impl.super__Vector_impl_data._M_start)->m_vertices).
                       super__Vector_base<iDynTree::Position,_std::allocator<iDynTree::Position>_>.
                       _M_impl.super__Vector_impl_data._M_start + lVar14);
      *puVar1 = local_d8.m_vertices.
                super__Vector_base<iDynTree::Position,_std::allocator<iDynTree::Position>_>._M_impl.
                super__Vector_impl_data._M_start;
      puVar1[1] = local_d8.m_vertices.
                  super__Vector_base<iDynTree::Position,_std::allocator<iDynTree::Position>_>.
                  _M_impl.super__Vector_impl_data._M_finish;
      *(pointer *)
       ((long)&((local_78.super__Vector_base<iDynTree::Polygon,_std::allocator<iDynTree::Polygon>_>.
                 _M_impl.super__Vector_impl_data._M_start)->m_vertices).
               super__Vector_base<iDynTree::Position,_std::allocator<iDynTree::Position>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage + lVar14) =
           local_d8.m_vertices.
           super__Vector_base<iDynTree::Position,_std::allocator<iDynTree::Position>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
      local_d8.m_vertices.
      super__Vector_base<iDynTree::Position,_std::allocator<iDynTree::Position>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_d8.m_vertices.
      super__Vector_base<iDynTree::Position,_std::allocator<iDynTree::Position>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_d8.m_vertices.
      super__Vector_base<iDynTree::Position,_std::allocator<iDynTree::Position>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      if ((pvVar2 != (void *)0x0) &&
         (operator_delete(pvVar2,lVar3 - (long)pvVar2),
         local_d8.m_vertices.
         super__Vector_base<iDynTree::Position,_std::allocator<iDynTree::Position>_>._M_impl.
         super__Vector_impl_data._M_start != (pointer)0x0)) {
        operator_delete(local_d8.m_vertices.
                        super__Vector_base<iDynTree::Position,_std::allocator<iDynTree::Position>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)local_d8.m_vertices.
                              super__Vector_base<iDynTree::Position,_std::allocator<iDynTree::Position>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_d8.m_vertices.
                              super__Vector_base<iDynTree::Position,_std::allocator<iDynTree::Position>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      uVar16 = uVar16 + 1;
      pPVar11 = (supportPolygonsExpressedInSupportFrame->
                super__Vector_base<iDynTree::Polygon,_std::allocator<iDynTree::Polygon>_>)._M_impl.
                super__Vector_impl_data._M_start;
      lVar14 = lVar14 + 0x18;
      lVar10 = lVar10 + 0x60;
    } while (uVar16 < (ulong)(((long)(supportPolygonsExpressedInSupportFrame->
                                     super__Vector_base<iDynTree::Polygon,_std::allocator<iDynTree::Polygon>_>
                                     )._M_impl.super__Vector_impl_data._M_finish - (long)pPVar11 >>
                              3) * -0x5555555555555555));
  }
  local_98 = (VectorFixSize<2U> *)0x0;
  iStack_90._M_current = (VectorFixSize<2U> *)0x0;
  local_88 = (VectorFixSize<2U> *)0x0;
  if (local_78.super__Vector_base<iDynTree::Polygon,_std::allocator<iDynTree::Polygon>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      local_78.super__Vector_base<iDynTree::Polygon,_std::allocator<iDynTree::Polygon>_>._M_impl.
      super__Vector_impl_data._M_start) {
    pvVar12 = (vector<iDynTree::Transform,_std::allocator<iDynTree::Transform>_> *)0x0;
    do {
      local_c0 = pvVar12;
      for (uVar16 = 0;
          sVar8 = Polygon::getNrOfVertices
                            (local_78.
                             super__Vector_base<iDynTree::Polygon,_std::allocator<iDynTree::Polygon>_>
                             ._M_impl.super__Vector_impl_data._M_start + (long)pvVar12),
          uVar16 < sVar8; uVar16 = uVar16 + 1) {
        pPVar9 = Polygon::operator()(local_78.
                                     super__Vector_base<iDynTree::Polygon,_std::allocator<iDynTree::Polygon>_>
                                     ._M_impl.super__Vector_impl_data._M_start + (long)pvVar12,
                                     uVar16);
        iDynTree::Position::operator-((Position *)&local_d8,pPVar9);
        dVar5 = (double)local_d8.m_vertices.
                        super__Vector_base<iDynTree::Position,_std::allocator<iDynTree::Position>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage *
                *(double *)&this->field_0x78 +
                *(double *)&this->field_0x70 *
                (double)local_d8.m_vertices.
                        super__Vector_base<iDynTree::Position,_std::allocator<iDynTree::Position>_>.
                        _M_impl.super__Vector_impl_data._M_finish +
                *(double *)&this->P *
                (double)local_d8.m_vertices.
                        super__Vector_base<iDynTree::Position,_std::allocator<iDynTree::Position>_>.
                        _M_impl.super__Vector_impl_data._M_start;
        dVar6 = (double)local_d8.m_vertices.
                        super__Vector_base<iDynTree::Position,_std::allocator<iDynTree::Position>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage *
                *(double *)&this->field_0x90 +
                *(double *)&this->field_0x88 *
                (double)local_d8.m_vertices.
                        super__Vector_base<iDynTree::Position,_std::allocator<iDynTree::Position>_>.
                        _M_impl.super__Vector_impl_data._M_finish +
                *(double *)&this->field_0x80 *
                (double)local_d8.m_vertices.
                        super__Vector_base<iDynTree::Position,_std::allocator<iDynTree::Position>_>.
                        _M_impl.super__Vector_impl_data._M_start;
        local_b8.m_data[1]._0_4_ = SUB84(dVar6,0);
        local_b8.m_data[0] = dVar5;
        local_b8.m_data[1]._4_4_ = (int)((ulong)dVar6 >> 0x20);
        if (iStack_90._M_current == local_88) {
          std::vector<iDynTree::VectorFixSize<2u>,std::allocator<iDynTree::VectorFixSize<2u>>>::
          _M_realloc_insert<iDynTree::VectorFixSize<2u>const&>
                    ((vector<iDynTree::VectorFixSize<2u>,std::allocator<iDynTree::VectorFixSize<2u>>>
                      *)&local_98,iStack_90,&local_b8);
        }
        else {
          (iStack_90._M_current)->m_data[0] = dVar5;
          (iStack_90._M_current)->m_data[1] = local_b8.m_data[1];
          iStack_90._M_current = iStack_90._M_current + 1;
        }
      }
      pvVar12 = local_c0 + 1;
    } while (pvVar12 < (vector<iDynTree::Transform,_std::allocator<iDynTree::Transform>_> *)
                       (((long)local_78.
                               super__Vector_base<iDynTree::Polygon,_std::allocator<iDynTree::Polygon>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                         (long)local_78.
                               super__Vector_base<iDynTree::Polygon,_std::allocator<iDynTree::Polygon>_>
                               ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555
                       ));
  }
  iVar7._M_current = (VectorFixSize<2U> *)iStack_90;
  if ((ulong)((long)iStack_90._M_current - (long)local_98) < 0x21) {
LAB_00109b3d:
    if (local_98 != (VectorFixSize<2U> *)0x0) {
      operator_delete(local_98,(long)local_88 - (long)local_98);
    }
    std::vector<iDynTree::Polygon,_std::allocator<iDynTree::Polygon>_>::~vector(&local_78);
    return false;
  }
  local_d8.m_vertices.super__Vector_base<iDynTree::Position,_std::allocator<iDynTree::Position>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_d8.m_vertices.super__Vector_base<iDynTree::Position,_std::allocator<iDynTree::Position>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_d8.m_vertices.super__Vector_base<iDynTree::Position,_std::allocator<iDynTree::Position>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_a8 = (double *)0x0;
  local_b8.m_data = (double  [2])ZEXT816(0);
  if (local_98 != iStack_90._M_current) {
    pVVar15 = local_98;
    do {
      local_58 = pVVar15->m_data[0];
      dStack_50 = pVVar15->m_data[1];
      if (local_d8.m_vertices.
          super__Vector_base<iDynTree::Position,_std::allocator<iDynTree::Position>_>._M_impl.
          super__Vector_impl_data._M_finish ==
          local_d8.m_vertices.
          super__Vector_base<iDynTree::Position,_std::allocator<iDynTree::Position>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                  ((vector<double,std::allocator<double>> *)&local_d8,
                   (iterator)
                   local_d8.m_vertices.
                   super__Vector_base<iDynTree::Position,_std::allocator<iDynTree::Position>_>.
                   _M_impl.super__Vector_impl_data._M_finish,&local_58);
      }
      else {
        *(double *)
         local_d8.m_vertices.
         super__Vector_base<iDynTree::Position,_std::allocator<iDynTree::Position>_>._M_impl.
         super__Vector_impl_data._M_finish = local_58;
        local_d8.m_vertices.
        super__Vector_base<iDynTree::Position,_std::allocator<iDynTree::Position>_>._M_impl.
        super__Vector_impl_data._M_finish =
             (pointer)((long)local_d8.m_vertices.
                             super__Vector_base<iDynTree::Position,_std::allocator<iDynTree::Position>_>
                             ._M_impl.super__Vector_impl_data._M_finish + 8);
      }
      if ((double *)local_b8.m_data[1] == local_a8) {
        std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                  ((vector<double,std::allocator<double>> *)&local_b8,(iterator)local_b8.m_data[1],
                   &dStack_50);
      }
      else {
        *(double *)local_b8.m_data[1] = dStack_50;
        local_b8.m_data[1] = (double)((long)local_b8.m_data[1] + 8);
      }
      pVVar15 = pVVar15 + 1;
    } while (pVVar15 != iVar7._M_current);
  }
  pVar17 = std::
           __minmax_element<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__ops::_Iter_less_iter>
                     (local_d8.m_vertices.
                      super__Vector_base<iDynTree::Position,_std::allocator<iDynTree::Position>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      local_d8.m_vertices.
                      super__Vector_base<iDynTree::Position,_std::allocator<iDynTree::Position>_>.
                      _M_impl.super__Vector_impl_data._M_finish);
  pVar18 = std::
           __minmax_element<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__ops::_Iter_less_iter>
                     (local_b8.m_data[0],local_b8.m_data[1]);
  local_48 = *pVar17.first._M_current._M_current;
  local_c0 = (vector<iDynTree::Transform,_std::allocator<iDynTree::Transform>_> *)
             *pVar17.second._M_current._M_current;
  local_40 = *pVar18.first._M_current._M_current;
  local_38 = *pVar18.second._M_current._M_current;
  std::vector<iDynTree::VectorFixSize<2U>,_std::allocator<iDynTree::VectorFixSize<2U>_>_>::resize
            (&(this->projectedBoundingBox).m_vertices,4);
  pVVar4 = (this->projectedBoundingBox).m_vertices.
           super__Vector_base<iDynTree::VectorFixSize<2U>,_std::allocator<iDynTree::VectorFixSize<2U>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->projectedBoundingBox).m_vertices.
      super__Vector_base<iDynTree::VectorFixSize<2U>,_std::allocator<iDynTree::VectorFixSize<2U>_>_>
      ._M_impl.super__Vector_impl_data._M_finish == pVVar4) {
    uVar13 = 0;
    uVar16 = 0;
  }
  else {
    pVVar4->m_data[0] = local_48;
    pVVar4->m_data[1] = local_38;
    pVVar4 = (this->projectedBoundingBox).m_vertices.
             super__Vector_base<iDynTree::VectorFixSize<2U>,_std::allocator<iDynTree::VectorFixSize<2U>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    uVar16 = (long)(this->projectedBoundingBox).m_vertices.
                   super__Vector_base<iDynTree::VectorFixSize<2U>,_std::allocator<iDynTree::VectorFixSize<2U>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish - (long)pVVar4 >> 4;
    if (uVar16 < 2) {
      uVar13 = 1;
    }
    else {
      pVVar4[1].m_data[0] = local_48;
      pVVar4[1].m_data[1] = local_40;
      pVVar4 = (this->projectedBoundingBox).m_vertices.
               super__Vector_base<iDynTree::VectorFixSize<2U>,_std::allocator<iDynTree::VectorFixSize<2U>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      uVar16 = (long)(this->projectedBoundingBox).m_vertices.
                     super__Vector_base<iDynTree::VectorFixSize<2U>,_std::allocator<iDynTree::VectorFixSize<2U>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish - (long)pVVar4 >> 4;
      if (uVar16 < 3) {
        uVar13 = 2;
      }
      else {
        pVVar4[2].m_data[0] = (double)local_c0;
        pVVar4[2].m_data[1] = local_40;
        pVVar4 = (this->projectedBoundingBox).m_vertices.
                 super__Vector_base<iDynTree::VectorFixSize<2U>,_std::allocator<iDynTree::VectorFixSize<2U>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        uVar16 = (long)(this->projectedBoundingBox).m_vertices.
                       super__Vector_base<iDynTree::VectorFixSize<2U>,_std::allocator<iDynTree::VectorFixSize<2U>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish - (long)pVVar4 >> 4;
        if (3 < uVar16) {
          pVVar4[3].m_data[0] = (double)local_c0;
          pVVar4[3].m_data[1] = local_38;
          buildConstraintMatrix(this);
          if ((void *)local_b8.m_data[0] != (void *)0x0) {
            operator_delete((void *)local_b8.m_data[0],(long)local_a8 - (long)local_b8.m_data[0]);
          }
          if (local_d8.m_vertices.
              super__Vector_base<iDynTree::Position,_std::allocator<iDynTree::Position>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_d8.m_vertices.
                            super__Vector_base<iDynTree::Position,_std::allocator<iDynTree::Position>_>
                            ._M_impl.super__Vector_impl_data._M_start,
                            (long)local_d8.m_vertices.
                                  super__Vector_base<iDynTree::Position,_std::allocator<iDynTree::Position>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_d8.m_vertices.
                                  super__Vector_base<iDynTree::Position,_std::allocator<iDynTree::Position>_>
                                  ._M_impl.super__Vector_impl_data._M_start);
          }
          goto LAB_00109b3d;
        }
        uVar13 = 3;
      }
    }
  }
  uVar13 = std::__throw_out_of_range_fmt
                     ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",
                      uVar13,uVar16);
  if ((void *)local_b8.m_data[0] != (void *)0x0) {
    operator_delete((void *)local_b8.m_data[0],(long)local_a8 - (long)local_b8.m_data[0]);
  }
  if (local_d8.m_vertices.
      super__Vector_base<iDynTree::Position,_std::allocator<iDynTree::Position>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_d8.m_vertices.
                    super__Vector_base<iDynTree::Position,_std::allocator<iDynTree::Position>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_d8.m_vertices.
                          super__Vector_base<iDynTree::Position,_std::allocator<iDynTree::Position>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_d8.m_vertices.
                          super__Vector_base<iDynTree::Position,_std::allocator<iDynTree::Position>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_98 != (VectorFixSize<2U> *)0x0) {
    operator_delete(local_98,(long)local_88 - (long)local_98);
  }
  std::vector<iDynTree::Polygon,_std::allocator<iDynTree::Polygon>_>::~vector(&local_78);
  _Unwind_Resume(uVar13);
}

Assistant:

bool BoundingBoxProjectionConstraint::buildBoundingBox(const iDynTree::Direction xAxisOfPlaneInWorld,
                                                         const iDynTree::Direction yAxisOfPlaneInWorld,
                                                         const iDynTree::Position originOfPlaneInWorld,
                                                         const std::vector<Polygon> &supportPolygonsExpressedInSupportFrame,
                                                         const std::vector<Transform> &absoluteFrame_X_supportFrame)
    {
      o = originOfPlaneInWorld;
      toEigen(P).block<1, 3>(0,0) = toEigen(xAxisOfPlaneInWorld);
      toEigen(P).block<1, 3>(1,0) = toEigen(yAxisOfPlaneInWorld);

      // Transform the polygons in the absolute frame
      std::vector<Polygon> supportPolygonsExpressedInAbsoluteFrame;

      supportPolygonsExpressedInAbsoluteFrame.resize(supportPolygonsExpressedInSupportFrame.size());

      for(size_t i=0; i< supportPolygonsExpressedInSupportFrame.size(); i++)
      {
          supportPolygonsExpressedInAbsoluteFrame[i] = supportPolygonsExpressedInSupportFrame[i].applyTransform(absoluteFrame_X_supportFrame[i]);
      }

      // Project the polygons on the projection plane
      std::vector<Vector2> projectedPoints;

      for(size_t poly=0; poly < supportPolygonsExpressedInAbsoluteFrame.size(); poly++)
      {
          for(size_t vertex=0; vertex < supportPolygonsExpressedInAbsoluteFrame[poly].getNrOfVertices(); vertex++)
          {
               Vector2 newProjectedPoint = project(supportPolygonsExpressedInAbsoluteFrame[poly](vertex));
               //toEigen(newProjectedPoint) = toEigen(P)*toEigen(supportPolygonsExpressedInAbsoluteFrame[poly](vertex)-o);
               projectedPoints.push_back(newProjectedPoint);
          }
      }

      if (projectedPoints.size() <= 2)
      {
          return false;
      }

      // Compute the bounding box
      //  Build a vector from projectedPoints with the x coordinates
      std::vector<double> xCoords;
      std::vector<double> yCoords;
      for (auto point : projectedPoints) {
          xCoords.push_back(point(0));
          yCoords.push_back(point(1));
      }

      // Find min and max x coordinate
      auto minMaxXCoord = std::minmax_element(xCoords.begin(), xCoords.end());
      auto minMaxYCoord = std::minmax_element(yCoords.begin(), yCoords.end());
      double minX, maxX, minY, maxY;
      minX = *minMaxXCoord.first;
      maxX = *minMaxXCoord.second;
      minY = *minMaxYCoord.first;
      maxY = *minMaxYCoord.second;

      // Compute bounding box
      Vector2 vec1, vec2, vec3, vec4;
      vec1(0) = minX; vec1(1) = maxY;
      vec2(0) = maxX; vec2(1) = maxY;
      vec3(0) = maxX; vec3(1) = minY;
      vec4(0) = minX; vec4(1) = minY;

      projectedBoundingBox.m_vertices.resize(4);
      projectedBoundingBox.m_vertices.at(0) = vec1;
      projectedBoundingBox.m_vertices.at(1) = vec4;
      projectedBoundingBox.m_vertices.at(2) = vec3;
      projectedBoundingBox.m_vertices.at(3) = vec2;

      // Build the constraint matrix
      buildConstraintMatrix();
      return false;

      // Update AtimesP matrix
      AtimesP.resize(A.rows(),P.cols());

      toEigen(AtimesP) = toEigen(A)*toEigen(P);

      return true;
    }